

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

int __thiscall
QAccessibleMenuBar::indexOfChild(QAccessibleMenuBar *this,QAccessibleInterface *child)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  QWidget *this_00;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  QList<QAction_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**(code **)(*(long *)child + 0x78))(child);
  iVar4 = -1;
  if ((iVar2 == 0x15) || (iVar2 == 0xc)) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar3 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar3 != 0) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      QWidget::actions(&local_38,this_00);
      (**(code **)(*(long *)child + 0x18))(child);
      lVar3 = QMetaObject::cast((QObject *)&QAction::staticMetaObject);
      if (local_38.d.size == 0) {
LAB_00518d23:
        iVar4 = -1;
      }
      else {
        iVar4 = -1;
        lVar5 = 0;
        do {
          if (local_38.d.size << 3 == lVar5) goto LAB_00518d23;
          iVar4 = iVar4 + 1;
          plVar1 = (long *)((long)local_38.d.ptr + lVar5);
          lVar5 = lVar5 + 8;
        } while (*plVar1 != lVar3);
      }
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QAccessibleMenuBar::indexOfChild(const QAccessibleInterface *child) const
{
    QAccessible::Role r = child->role();
    if ((r == QAccessible::MenuItem || r == QAccessible::Separator) && menuBar()) {
        return menuBar()->actions().indexOf(qobject_cast<QAction*>(child->object()));
    }
    return -1;
}